

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O0

void __thiscall XMISong::DoRestart(XMISong *this)

{
  DWORD DVar1;
  EventSource EVar2;
  XMISong *this_local;
  
  this->CurrSong->EventP = 0;
  this->CurrSong->Finished = false;
  this->CurrSong->PlayedTime = 0;
  this->CurrSong->ForDepth = 0;
  TArray<AutoNoteOff,_AutoNoteOff>::Clear(&(this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>);
  ProcessInitialMetaEvents(this);
  DVar1 = TrackInfo::ReadDelay(this->CurrSong);
  this->CurrSong->Delay = DVar1;
  EVar2 = FindNextDue(this);
  this->EventDue = EVar2;
  return;
}

Assistant:

void XMISong::DoRestart()
{
	CurrSong->EventP = 0;
	CurrSong->Finished = false;
	CurrSong->PlayedTime = 0;
	CurrSong->ForDepth = 0;
	NoteOffs.Clear();

	ProcessInitialMetaEvents ();

	CurrSong->Delay = CurrSong->ReadDelay();
	EventDue = FindNextDue();
}